

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void do_ext64(DisasContext_conflict1 *s,TCGv_i64 tcg_left,TCGv_i64 tcg_right,int pos)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i64 ret;
  TCGv_i64 tcg_tmp;
  TCGContext_conflict1 *tcg_ctx;
  int pos_local;
  TCGv_i64 tcg_right_local;
  TCGv_i64 tcg_left_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret = tcg_temp_new_i64(tcg_ctx_00);
  if ((0 < pos) && (pos < 0x40)) {
    tcg_gen_shri_i64_aarch64(tcg_ctx_00,tcg_right,tcg_right,(long)pos);
    tcg_gen_shli_i64_aarch64(tcg_ctx_00,ret,tcg_left,(long)(0x40 - pos));
    tcg_gen_or_i64_aarch64(tcg_ctx_00,tcg_right,tcg_right,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
    return;
  }
  __assert_fail("pos > 0 && pos < 64",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x1bf0,"void do_ext64(DisasContext *, TCGv_i64, TCGv_i64, int)");
}

Assistant:

static void do_ext64(DisasContext *s, TCGv_i64 tcg_left, TCGv_i64 tcg_right,
                     int pos)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Extract 64 bits from the middle of two concatenated 64 bit
     * vector register slices left:right. The extracted bits start
     * at 'pos' bits into the right (least significant) side.
     * We return the result in tcg_right, and guarantee not to
     * trash tcg_left.
     */
    TCGv_i64 tcg_tmp = tcg_temp_new_i64(tcg_ctx);
    assert(pos > 0 && pos < 64);

    tcg_gen_shri_i64(tcg_ctx, tcg_right, tcg_right, pos);
    tcg_gen_shli_i64(tcg_ctx, tcg_tmp, tcg_left, 64 - pos);
    tcg_gen_or_i64(tcg_ctx, tcg_right, tcg_right, tcg_tmp);

    tcg_temp_free_i64(tcg_ctx, tcg_tmp);
}